

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

double __thiscall
TPZMatrix<double>::MatrixNorm(TPZMatrix<double> *this,int p,int64_t numiter,REAL tol)

{
  long size;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  TPZVec<double> ROW;
  TPZVec<double> EigenVal;
  TPZFMatrix<double> transp;
  undefined1 local_148 [16];
  REAL local_110;
  int64_t local_108;
  TPZVec<double> local_100;
  TPZVec<double> local_e0;
  TPZFMatrix<double> local_c0;
  
  size = (this->super_TPZBaseMatrix).fRow;
  dVar10 = 0.0;
  if (size != 0) {
    local_110 = tol;
    local_108 = numiter;
    if (size != (this->super_TPZBaseMatrix).fCol) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TVar TPZMatrix<>::MatrixNorm(int, int64_t, REAL) const [TVar = double]",0x46);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - matrix must be square - Rows() = ",0x24);
      poVar6 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," - Cols() = ",0xc);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    dVar10 = 0.0;
    if (p == 0) {
      if (0 < size) {
        dVar10 = 0.0;
        uVar13 = 0;
        lVar8 = 0;
        do {
          dVar3 = 0.0;
          lVar7 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar8,lVar7)
            ;
            dVar3 = dVar3 + ABS(extraout_XMM0_Qa_02);
            lVar7 = lVar7 + 1;
          } while (size != lVar7);
          auVar12._0_8_ = ~-(ulong)(ABS(dVar10) < dVar3) & (ulong)dVar10;
          auVar12._8_8_ = ~(uVar13 & 0x7fffffffffffffff) & uVar13;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (ulong)dVar3 & -(ulong)(ABS(dVar10) < dVar3);
          lVar8 = lVar8 + 1;
          dVar10 = SUB168(auVar12 | auVar2,0);
          uVar13 = SUB168(auVar12 | auVar2,8);
        } while (lVar8 != size);
      }
    }
    else if (p == 2) {
      local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018151d8;
      local_c0.fElem = (double *)0x0;
      local_c0.fGiven = (double *)0x0;
      local_c0.fSize = 0;
      local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = size;
      local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = size;
      TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
      local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
      local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_c0.fWork.fStore = (double *)0x0;
      local_c0.fWork.fNElements = 0;
      local_c0.fWork.fNAlloc = 0;
      local_c0.fElem =
           (double *)operator_new__(-(ulong)((ulong)(size * size) >> 0x3d != 0) | size * size * 8);
      if (0 < size) {
        lVar8 = 0;
        do {
          lVar7 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar7,lVar8)
            ;
            local_148._0_8_ = extraout_XMM0_Qa_00;
            if ((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
               (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_c0.fElem
            [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar8] =
                 extraout_XMM0_Qa_00;
            lVar7 = lVar7 + 1;
          } while (size != lVar7);
          lVar8 = lVar8 + 1;
        } while (lVar8 != size);
      }
      TPZVec<double>::TPZVec(&local_100,size);
      if (0 < size) {
        lVar8 = 0;
        do {
          lVar7 = 0;
          do {
            if ((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
               (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_100.fStore[lVar7] =
                 local_c0.fElem
                 [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar8];
            lVar7 = lVar7 + 1;
          } while (size != lVar7);
          lVar7 = 0;
          do {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_148._8_8_;
            local_148 = auVar4 << 0x40;
            lVar9 = 0;
            do {
              dVar10 = local_100.fStore[lVar9];
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                        (this,lVar9,lVar7);
              dVar10 = (double)local_148._0_8_ + dVar10 * extraout_XMM0_Qa_01;
              local_148._0_8_ = dVar10;
              lVar9 = lVar9 + 1;
            } while (size != lVar9);
            if ((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
               (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_c0.fElem
            [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar8] = dVar10;
            lVar7 = lVar7 + 1;
          } while (lVar7 != size);
          lVar8 = lVar8 + 1;
        } while (lVar8 != size);
      }
      local_e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_e0.fStore = (double *)0x0;
      local_e0.fNElements = 0;
      local_e0.fNAlloc = 0;
      bVar5 = SolveEigenvaluesJacobi
                        (&local_c0.super_TPZMatrix<double>,&local_108,&local_110,&local_e0);
      if (!bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "TVar TPZMatrix<>::MatrixNorm(int, int64_t, REAL) const [TVar = double]",0x46);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," - it was not possible to find Eigenvalues. Iterations = "
                   ,0x39);
        poVar6 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," - error found = ",0x11);
        poVar6 = std::ostream::_M_insert<double>(local_110);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      dVar10 = *local_e0.fStore;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      local_e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      if (local_e0.fStore != (double *)0x0) {
        operator_delete__(local_e0.fStore);
      }
      local_100._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      if (local_100.fStore != (double *)0x0) {
        operator_delete__(local_100.fStore);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_c0);
    }
    else if (p == 1) {
      if (0 < size) {
        dVar10 = 0.0;
        uVar13 = 0;
        lVar8 = 0;
        do {
          dVar3 = 0.0;
          lVar7 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar7,lVar8)
            ;
            dVar3 = dVar3 + ABS(extraout_XMM0_Qa);
            lVar7 = lVar7 + 1;
          } while (size != lVar7);
          auVar11._0_8_ = ~-(ulong)(ABS(dVar10) < dVar3) & (ulong)dVar10;
          auVar11._8_8_ = ~(uVar13 & 0x7fffffffffffffff) & uVar13;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (ulong)dVar3 & -(ulong)(ABS(dVar10) < dVar3);
          lVar8 = lVar8 + 1;
          dVar10 = SUB168(auVar11 | auVar1,0);
          uVar13 = SUB168(auVar11 | auVar1,8);
        } while (lVar8 != size);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TVar TPZMatrix<>::MatrixNorm(int, int64_t, REAL) const [TVar = double]",0x46);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," p = ",5);
      poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not a correct option",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      dVar10 = 0.0;
    }
  }
  return dVar10;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}